

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryOperatorOverloadTest.cpp
# Opt level: O0

void __thiscall
TEST_OutOfMemoryTestsForOperatorNew_FailingNewOperatorThrowsAnExceptionWhenUsingStdCppNew_Test::
testBody(TEST_OutOfMemoryTestsForOperatorNew_FailingNewOperatorThrowsAnExceptionWhenUsingStdCppNew_Test
         *this)

{
  UtestShell *pUVar1;
  char *pcVar2;
  TestTerminator *pTVar3;
  bad_alloc *anon_var_0;
  undefined1 local_20 [7];
  bool caught_expected;
  SimpleString failure_msg;
  TEST_OutOfMemoryTestsForOperatorNew_FailingNewOperatorThrowsAnExceptionWhenUsingStdCppNew_Test
  *this_local;
  
  failure_msg.bufferSize_ = (size_t)this;
  SimpleString::SimpleString
            ((SimpleString *)local_20,"expected to throw CPPUTEST_BAD_ALLOC\nbut threw nothing");
  operator_new(1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
               ,0x171);
  pUVar1 = UtestShell::getCurrent();
  pcVar2 = SimpleString::asCharString((SimpleString *)local_20);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[0x1a])
            (pUVar1,pcVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryOperatorOverloadTest.cpp"
             ,0x171,pTVar3);
  SimpleString::~SimpleString((SimpleString *)local_20);
  return;
}

Assistant:

TEST(OutOfMemoryTestsForOperatorNew, FailingNewOperatorThrowsAnExceptionWhenUsingStdCppNew)
{
    CHECK_THROWS(CPPUTEST_BAD_ALLOC, new char);
}